

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_inherit_refine
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents,TagBase *tagbase)

{
  LOs same_ents2old_ents_00;
  LOs same_ents2old_ents_01;
  LOs same_ents2old_ents_02;
  LOs same_ents2old_ents_03;
  LOs same_ents2new_ents_00;
  LOs same_ents2new_ents_01;
  LOs same_ents2new_ents_02;
  LOs same_ents2new_ents_03;
  undefined4 uVar1;
  Alloc *pAVar2;
  Alloc *this;
  Write<int> *this_00;
  Write<int> *this_01;
  Write<int> *this_02;
  Write<int> *this_03;
  void *pvVar3;
  undefined4 in_stack_fffffffffffffe78;
  Write<int> local_170;
  undefined1 local_160 [32];
  Write<int> local_140;
  Write<int> local_130;
  Write<int> local_120;
  undefined1 local_110 [32];
  Write<int> local_f0;
  Write<int> local_e0;
  Write<int> local_d0;
  undefined1 local_c0 [32];
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80 [2];
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  
  uVar1 = (**(code **)((same_ents2new_ents.write_.shared_alloc_.alloc)->size + 0x10))
                    (same_ents2new_ents.write_.shared_alloc_.alloc);
  switch(uVar1) {
  case 0:
    Write<int>::Write(&local_40,&keys2edges->write_);
    this_02 = &local_50;
    Write<int>::Write(this_02,&keys2prods->write_);
    this_01 = &local_60;
    Write<int>::Write(this_01,&prods2new_ents->write_);
    this = (Alloc *)(local_80 + 1);
    Write<int>::Write((Write<int> *)this,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc
                     );
    this_03 = local_80;
    Write<int>::Write(this_03,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
    pvVar3 = (void *)0x34d251;
    pAVar2 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    this_00 = &local_40;
    same_ents2old_ents_00.write_.shared_alloc_.direct_ptr = this_03;
    same_ents2old_ents_00.write_.shared_alloc_.alloc = this;
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr = pvVar3;
    same_ents2new_ents_00.write_.shared_alloc_.alloc = pAVar2;
    transfer_inherit_refine<signed_char>
              (old_mesh,new_mesh,(LOs *)this_00,prod_dim,(LOs *)this_02,(LOs *)this_01,
               same_ents2old_ents_00,same_ents2new_ents_00,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe78));
    break;
  default:
    goto switchD_0034d1e1_caseD_1;
  case 2:
    Write<int>::Write(&local_90,&keys2edges->write_);
    this_02 = &local_a0;
    Write<int>::Write(this_02,&keys2prods->write_);
    this_01 = (Write<int> *)(local_c0 + 0x10);
    Write<int>::Write(this_01,&prods2new_ents->write_);
    this = (Alloc *)local_c0;
    Write<int>::Write((Write<int> *)this,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc
                     );
    this_03 = &local_d0;
    Write<int>::Write(this_03,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
    pvVar3 = (void *)0x34d38d;
    pAVar2 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    this_00 = &local_90;
    same_ents2old_ents_02.write_.shared_alloc_.direct_ptr = this_03;
    same_ents2old_ents_02.write_.shared_alloc_.alloc = this;
    same_ents2new_ents_02.write_.shared_alloc_.direct_ptr = pvVar3;
    same_ents2new_ents_02.write_.shared_alloc_.alloc = pAVar2;
    transfer_inherit_refine<int>
              (old_mesh,new_mesh,(LOs *)this_00,prod_dim,(LOs *)this_02,(LOs *)this_01,
               same_ents2old_ents_02,same_ents2new_ents_02,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe78));
    break;
  case 3:
    Write<int>::Write(&local_e0,&keys2edges->write_);
    this_02 = &local_f0;
    Write<int>::Write(this_02,&keys2prods->write_);
    this_01 = (Write<int> *)(local_110 + 0x10);
    Write<int>::Write(this_01,&prods2new_ents->write_);
    this = (Alloc *)local_110;
    Write<int>::Write((Write<int> *)this,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc
                     );
    this_03 = &local_120;
    Write<int>::Write(this_03,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
    pvVar3 = (void *)0x34d2ec;
    pAVar2 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    this_00 = &local_e0;
    same_ents2old_ents_01.write_.shared_alloc_.direct_ptr = this_03;
    same_ents2old_ents_01.write_.shared_alloc_.alloc = this;
    same_ents2new_ents_01.write_.shared_alloc_.direct_ptr = pvVar3;
    same_ents2new_ents_01.write_.shared_alloc_.alloc = pAVar2;
    transfer_inherit_refine<long>
              (old_mesh,new_mesh,(LOs *)this_00,prod_dim,(LOs *)this_02,(LOs *)this_01,
               same_ents2old_ents_01,same_ents2new_ents_01,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe78));
    break;
  case 5:
    Write<int>::Write(&local_130,&keys2edges->write_);
    this_02 = &local_140;
    Write<int>::Write(this_02,&keys2prods->write_);
    this_01 = (Write<int> *)(local_160 + 0x10);
    Write<int>::Write(this_01,&prods2new_ents->write_);
    this = (Alloc *)local_160;
    Write<int>::Write((Write<int> *)this,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc
                     );
    this_03 = &local_170;
    Write<int>::Write(this_03,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
    pvVar3 = (void *)0x34d41f;
    pAVar2 = (Alloc *)TagBase::name_abi_cxx11_
                                ((TagBase *)same_ents2new_ents.write_.shared_alloc_.alloc);
    this_00 = &local_130;
    same_ents2old_ents_03.write_.shared_alloc_.direct_ptr = this_03;
    same_ents2old_ents_03.write_.shared_alloc_.alloc = this;
    same_ents2new_ents_03.write_.shared_alloc_.direct_ptr = pvVar3;
    same_ents2new_ents_03.write_.shared_alloc_.alloc = pAVar2;
    transfer_inherit_refine<double>
              (old_mesh,new_mesh,(LOs *)this_00,prod_dim,(LOs *)this_02,(LOs *)this_01,
               same_ents2old_ents_03,same_ents2new_ents_03,
               (string *)CONCAT44(prod_dim,in_stack_fffffffffffffe78));
  }
  Write<int>::~Write(this_03);
  Write<int>::~Write((Write<int> *)this);
  Write<int>::~Write(this_01);
  Write<int>::~Write(this_02);
  Write<int>::~Write(this_00);
switchD_0034d1e1_caseD_1:
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, TagBase const* tagbase) {
  switch (tagbase->type()) {
    case OMEGA_H_I8:
      transfer_inherit_refine<I8>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I32:
      transfer_inherit_refine<I32>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_I64:
      transfer_inherit_refine<I64>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
    case OMEGA_H_F64:
      transfer_inherit_refine<Real>(old_mesh, new_mesh, keys2edges, prod_dim,
          keys2prods, prods2new_ents, same_ents2old_ents, same_ents2new_ents,
          tagbase->name());
      break;
  }
}